

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  undefined8 uVar1;
  int iVar2;
  DataKey *pDVar3;
  long lVar4;
  uint *puVar5;
  uint *puVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  uint *puVar8;
  uint *puVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  byte bVar11;
  SPxId enterId;
  SPxId enterIdCo;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_238;
  DataKey local_230;
  cpp_dec_float<200U,_int,_void> local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  cpp_dec_float<200U,_int,_void> local_128;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar11 = 0;
  local_238.info = 0;
  local_238.idx = -1;
  local_230.info = 0;
  local_230.idx = -1;
  puVar8 = local_228.data._M_elems;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems[6] = 0;
  local_228.data._M_elems[7] = 0;
  local_228.data._M_elems[8] = 0;
  local_228.data._M_elems[9] = 0;
  local_228.data._M_elems[10] = 0;
  local_228.data._M_elems[0xb] = 0;
  local_228.data._M_elems[0xc] = 0;
  local_228.data._M_elems[0xd] = 0;
  local_228.data._M_elems[0xe] = 0;
  local_228.data._M_elems[0xf] = 0;
  local_228.data._M_elems[0x10] = 0;
  local_228.data._M_elems[0x11] = 0;
  local_228.data._M_elems[0x12] = 0;
  local_228.data._M_elems[0x13] = 0;
  local_228.data._M_elems[0x14] = 0;
  local_228.data._M_elems[0x15] = 0;
  local_228.data._M_elems[0x16] = 0;
  local_228.data._M_elems[0x17] = 0;
  local_228.data._M_elems[0x18] = 0;
  local_228.data._M_elems[0x19] = 0;
  local_228.data._M_elems._104_5_ = 0;
  local_228.data._M_elems[0x1b]._1_3_ = 0;
  puVar9 = local_1a8.m_backend.data._M_elems;
  local_1a8.m_backend.data._M_elems[0] = 0;
  local_1a8.m_backend.data._M_elems[1] = 0;
  local_1a8.m_backend.data._M_elems[2] = 0;
  local_1a8.m_backend.data._M_elems[3] = 0;
  local_1a8.m_backend.data._M_elems[4] = 0;
  local_1a8.m_backend.data._M_elems[5] = 0;
  local_1a8.m_backend.data._M_elems[6] = 0;
  local_1a8.m_backend.data._M_elems[7] = 0;
  local_1a8.m_backend.data._M_elems[8] = 0;
  local_1a8.m_backend.data._M_elems[9] = 0;
  local_1a8.m_backend.data._M_elems[10] = 0;
  local_1a8.m_backend.data._M_elems[0xb] = 0;
  local_1a8.m_backend.data._M_elems[0xc] = 0;
  local_1a8.m_backend.data._M_elems[0xd] = 0;
  local_1a8.m_backend.data._M_elems[0xe] = 0;
  local_1a8.m_backend.data._M_elems[0xf] = 0;
  local_1a8.m_backend.data._M_elems[0x10] = 0;
  local_1a8.m_backend.data._M_elems[0x11] = 0;
  local_1a8.m_backend.data._M_elems[0x12] = 0;
  local_1a8.m_backend.data._M_elems[0x13] = 0;
  local_1a8.m_backend.data._M_elems[0x14] = 0;
  local_1a8.m_backend.data._M_elems[0x15] = 0;
  local_1a8.m_backend.data._M_elems[0x16] = 0;
  local_1a8.m_backend.data._M_elems[0x17] = 0;
  local_1a8.m_backend.data._M_elems[0x18] = 0;
  local_1a8.m_backend.data._M_elems[0x19] = 0;
  local_1a8.m_backend.data._M_elems._104_5_ = 0;
  local_1a8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_228.data._M_elems[0] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[0];
  puVar6 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 1;
  puVar5 = puVar6;
  for (lVar4 = 0x1b; puVar8 = puVar8 + 1, lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = *puVar5;
    puVar5 = puVar5 + 1;
  }
  local_228.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  uVar1._0_4_ = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thetolerance.m_backend.fpclass;
  uVar1._4_4_ = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thetolerance.m_backend.prec_elem;
  local_228.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_228.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_228.neg =
       (bool)((local_228.data._M_elems[0] != 0 ||
              (this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.fpclass != cpp_dec_float_finite) ^
             (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg);
  local_228.data._M_elems[1] = 0;
  for (lVar4 = 0x1b; puVar9 = puVar9 + 1, lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar9 = *puVar6;
    puVar6 = puVar6 + 1;
  }
  local_1a8.m_backend.data._M_elems[0] = local_228.data._M_elems[0];
  local_1a8.m_backend.exp = local_228.exp;
  local_1a8.m_backend.neg = local_228.neg;
  local_1a8.m_backend._120_8_ = uVar1;
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnter == true) {
    local_238 = (DataKey)selectEnterSparseDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_228,(SPxId *)&local_238);
  }
  else {
    local_238 = (DataKey)selectEnterDenseDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_228,(SPxId *)&local_238);
  }
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnterCo == true) {
    local_230 = (DataKey)selectEnterSparseCoDim(this,&local_1a8,(SPxId *)&local_238);
  }
  else {
    local_230 = (DataKey)selectEnterDenseCoDim(this,&local_1a8,(SPxId *)&local_238);
  }
  if (local_238.info != 0) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x1c;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems[0xe] = 0;
    local_128.data._M_elems[0xf] = 0;
    local_128.data._M_elems[0x10] = 0;
    local_128.data._M_elems[0x11] = 0;
    local_128.data._M_elems[0x12] = 0;
    local_128.data._M_elems[0x13] = 0;
    local_128.data._M_elems[0x14] = 0;
    local_128.data._M_elems[0x15] = 0;
    local_128.data._M_elems[0x16] = 0;
    local_128.data._M_elems[0x17] = 0;
    local_128.data._M_elems[0x18] = 0;
    local_128.data._M_elems[0x19] = 0;
    local_128.data._M_elems._104_5_ = 0;
    local_128.data._M_elems[0x1b]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 0x1c;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems[6] = 0;
    local_a8.data._M_elems[7] = 0;
    local_a8.data._M_elems[8] = 0;
    local_a8.data._M_elems[9] = 0;
    local_a8.data._M_elems[10] = 0;
    local_a8.data._M_elems[0xb] = 0;
    local_a8.data._M_elems[0xc] = 0;
    local_a8.data._M_elems[0xd] = 0;
    local_a8.data._M_elems[0xe] = 0;
    local_a8.data._M_elems[0xf] = 0;
    local_a8.data._M_elems[0x10] = 0;
    local_a8.data._M_elems[0x11] = 0;
    local_a8.data._M_elems[0x12] = 0;
    local_a8.data._M_elems[0x13] = 0;
    local_a8.data._M_elems[0x14] = 0;
    local_a8.data._M_elems[0x15] = 0;
    local_a8.data._M_elems[0x16] = 0;
    local_a8.data._M_elems[0x17] = 0;
    local_a8.data._M_elems[0x18] = 0;
    local_a8.data._M_elems[0x19] = 0;
    local_a8.data._M_elems._104_5_ = 0;
    local_a8.data._M_elems[0x1b]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,0.8);
    pnVar7 = &local_1a8;
    pcVar10 = &local_128;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pcVar10->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + (ulong)bVar11 * -8 + 4);
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar11 * -8 + 4);
    }
    local_128.exp = local_1a8.m_backend.exp;
    local_128.neg = local_1a8.m_backend.neg;
    local_128.fpclass = local_1a8.m_backend.fpclass;
    local_128.prec_elem = local_1a8.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_128,&local_a8);
    if ((((local_228.fpclass != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
        (iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_228,&local_128), pDVar3 = &local_238, 0 < iVar2)) ||
       (pDVar3 = &local_238, local_230.info == 0)) goto LAB_005b6aca;
  }
  pDVar3 = &local_230;
LAB_005b6aca:
  return (SPxId)*pDVar3;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}